

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O3

string * __thiscall
clipp::usage_lines::joined_label_abi_cxx11_
          (string *__return_storage_ptr__,usage_lines *this,group *g,context *cur)

{
  child_t<clipp::parameter,_clipp::group> *pcVar1;
  pointer pcVar2;
  bool bVar3;
  __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
  _Var4;
  byte bVar5;
  pointer pcVar6;
  size_type n;
  arg_string pfx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type local_58;
  arg_string local_50;
  
  if ((((this->fmt_).mergeAltCommonPfx_ == false) && ((this->fmt_).mergeJoinableCommonPfx_ == false)
      ) || (pcVar1 = (g->children_).
                     super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
           _Var4 = std::
                   __find_if<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,__gnu_cxx::__ops::_Iter_negate<clipp::usage_lines::joined_label[abi:cxx11](clipp::group_const&,clipp::usage_lines::context_const&)const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>>
                             ((g->children_).
                              super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,pcVar1),
           _Var4._M_current != pcVar1)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  pcVar1 = (g->children_).
           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,__gnu_cxx::__ops::_Iter_pred<clipp::group::any_required()const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>>
                    ((g->children_).
                     super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,pcVar1);
  if (_Var4._M_current == pcVar1) {
    bVar5 = this->ommitOutermostSurrounders_ ^ 1U | cur->outermost != g;
  }
  else {
    bVar5 = 0;
  }
  group::common_flag_prefix_abi_cxx11_(&local_50,g);
  if (local_50._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_58 = local_50._M_string_length;
    if ((g->exclusive_ == true) && ((this->fmt_).mergeAltCommonPfx_ == true)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (bVar5 != 0) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(this->fmt_).optionPre_._M_dataplus._M_p);
      }
      std::operator+(&local_78,&local_50,&(this->fmt_).alternPre_);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pcVar6 = (g->children_).
               super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = (g->children_).
               super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pcVar6 != pcVar2) {
        bVar3 = true;
        do {
          if (pcVar6->type_ == param) {
            if (!bVar3) {
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,
                         (ulong)(this->fmt_).altParamSep_._M_dataplus._M_p);
            }
            std::__cxx11::string::substr
                      ((ulong)&local_78,
                       (ulong)(pcVar6->m_).param.flags_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            bVar3 = false;
          }
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 != pcVar2);
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(this->fmt_).alternPst_._M_dataplus._M_p);
      if (bVar5 != 0) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(this->fmt_).optionPst_._M_dataplus._M_p);
      }
    }
    else if ((g->joinable_ == true) &&
            (((this->fmt_).mergeJoinableCommonPfx_ == true &&
             (pcVar1 = (g->children_).
                       super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
             _Var4 = std::
                     __find_if<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,__gnu_cxx::__ops::_Iter_negate<clipp::usage_lines::joined_label[abi:cxx11](clipp::group_const&,clipp::usage_lines::context_const&)const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_2_>>
                               ((g->children_).
                                super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,pcVar1,&local_58),
             _Var4._M_current == pcVar1)))) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (bVar5 != 0) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(this->fmt_).optionPre_._M_dataplus._M_p);
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      pcVar6 = (g->children_).
               super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = (g->children_).
               super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pcVar6 != pcVar2) {
        do {
          if (pcVar6->type_ == param) {
            std::__cxx11::string::substr
                      ((ulong)&local_78,
                       (ulong)(pcVar6->m_).param.flags_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
          }
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 != pcVar2);
      }
      if (bVar5 != 0) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(this->fmt_).optionPst_._M_dataplus._M_p);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

string joined_label(const group& g, const context& cur) const
    {
        if(!fmt_.merge_alternative_flags_with_common_prefix() &&
           !fmt_.merge_joinable_with_common_prefix()) return "";

        const bool flagsonly = std::all_of(g.begin(), g.end(),
            [](const pattern& p){
                return p.is_param() && !p.as_param().flags().empty();
            });

        if(!flagsonly) return "";

        const bool showOpt = g.all_optional() &&
            !(ommitOutermostSurrounders_ && cur.outermost == &g);

        auto pfx = g.common_flag_prefix();
        if(pfx.empty()) return "";

        const auto n = pfx.size();
        if(g.exclusive() &&
           fmt_.merge_alternative_flags_with_common_prefix())
        {
            string lbl;
            if(showOpt) lbl += fmt_.optional_prefix();
            lbl += pfx + fmt_.alternatives_prefix();
            bool first = true;
            for(const auto& p : g) {
                if(p.is_param()) {
                    if(first)
                        first = false;
                    else
                        lbl += fmt_.alternative_param_separator();
                    lbl += p.as_param().flags().front().substr(n);
                }
            }
            lbl += fmt_.alternatives_postfix();
            if(showOpt) lbl += fmt_.optional_postfix();
            return lbl;
        }
        //no alternatives, but joinable flags
        else if(g.joinable() &&
            fmt_.merge_joinable_with_common_prefix())
        {
            const bool allSingleChar = std::all_of(g.begin(), g.end(),
                [&](const pattern& p){
                    return p.is_param() &&
                        p.as_param().flags().front().substr(n).size() == 1;
                });

            if(allSingleChar) {
                string lbl;
                if(showOpt) lbl += fmt_.optional_prefix();
                lbl += pfx;
                for(const auto& p : g) {
                    if(p.is_param())
                        lbl += p.as_param().flags().front().substr(n);
                }
                if(showOpt) lbl += fmt_.optional_postfix();
                return lbl;
            }
        }

        return "";
    }